

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdunzip.c
# Opt level: O2

int extract2fd(archive *a,char *pathname,int fd)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  size_t sVar7;
  ssize_t sVar8;
  char *__name;
  size_t sVar9;
  uint uVar10;
  long *plVar11;
  bool bVar12;
  bool bVar13;
  uchar *__buf;
  ulong uVar14;
  uchar *puVar15;
  
  uVar10 = (uint)a_opt;
  bVar13 = false;
  uVar14 = 0;
  bVar2 = false;
  do {
    __buf = buffer;
    if ((((uVar14 & 3) == 0 && fd != 1) & tty) == 1) {
      info(" %c\b\b",(ulong)(uint)(int)"|/-\\"[(uint)(uVar14 >> 2) & 3]);
    }
    sVar7 = archive_read_data(a,buffer,0x2000);
    if ((int)sVar7 != 0 && (long)sVar7 < 0) {
      __name = archive_error_string(a);
      plVar11 = (long *)0x1135e4;
      errorx("%s");
      do {
        plVar11 = (long *)*plVar11;
        if (plVar11 == (long *)0x0) {
          return 0;
        }
        iVar6 = fnmatch((char *)(plVar11 + 1),__name,(uint)C_opt << 4);
      } while (iVar6 != 0);
      return 1;
    }
    if ((bVar2 & a_opt) == 1) {
      if ((sVar7 == 0) || (buffer[0] != '\n')) {
        sVar8 = write(fd,"\r",1);
        bVar2 = false;
        if (sVar8 == 1) goto LAB_00104f8e;
LAB_001050d9:
        error("write(\'%s\')",pathname);
      }
      bVar2 = false;
      bVar5 = 1;
    }
    else {
LAB_00104f8e:
      bVar5 = a_opt;
      if (sVar7 == 0) {
        return uVar10;
      }
    }
    bVar3 = true;
    if (((int)uVar14 == 0 & bVar5) == 1) {
      bVar12 = true;
      for (sVar9 = 0; sVar7 != sVar9; sVar9 = sVar9 + 1) {
        bVar1 = buffer[sVar9];
        if (bVar1 < 0x20) {
          if ((0xf3ffc07fU >> (bVar1 & 0x1f) & 1) != 0) goto LAB_00104fe1;
          if ((1 << (bVar1 & 0x1f) & 0x2600U) != 0) goto LAB_00104fd6;
        }
        else {
LAB_00104fd6:
          bVar12 = false;
        }
      }
      if (!bVar12) goto LAB_00104fe8;
LAB_00104fe1:
      uVar10 = 0;
LAB_00105095:
      sVar9 = write(fd,buffer,sVar7);
      if (sVar9 != sVar7) goto LAB_001050d9;
    }
    else {
LAB_00104fe8:
      if ((bVar5 & uVar10 != 0) != 1) goto LAB_00105095;
      puVar15 = buffer + sVar7;
      while (__buf < puVar15) {
        bVar12 = bVar13;
        for (sVar7 = 0; bVar4 = bVar2, bVar13 = bVar12, __buf + sVar7 < puVar15; sVar7 = sVar7 + 1)
        {
          bVar13 = bVar3;
          if (bVar12) {
LAB_0010501f:
            if ((__buf[sVar7] == '\r') &&
               ((bVar4 = bVar3, __buf + sVar7 + 1 == puVar15 ||
                (bVar4 = bVar2, __buf[sVar7 + 1] == '\n')))) break;
          }
          else {
            bVar13 = false;
            if (__buf[sVar7] < 0x20) {
              if ((0xf3ffc07fU >> (__buf[sVar7] & 0x1f) & 1) == 0) {
                bVar13 = false;
              }
              else {
                warningx("%s may be corrupted due to weak text file detection heuristic",pathname);
                bVar13 = bVar3;
              }
              goto LAB_0010501f;
            }
          }
          bVar12 = bVar13;
        }
        bVar2 = bVar4;
        sVar9 = write(fd,__buf,sVar7);
        __buf = __buf + sVar7 + 1;
        if (sVar9 != sVar7) goto LAB_001050d9;
      }
    }
    uVar14 = (ulong)((int)uVar14 + 1);
  } while( true );
}

Assistant:

static int
extract2fd(struct archive *a, char *pathname, int fd)
{
	int cr, text, warn;
	ssize_t len;
	unsigned char *p, *q, *end;

	text = a_opt;
	warn = 0;
	cr = 0;

	/* loop over file contents and write to fd */
	for (int n = 0; ; n++) {
		if (fd != STDOUT_FILENO)
			if (tty && (n % 4) == 0)
				info(" %c\b\b", spinner[(n / 4) % sizeof spinner]);

		len = archive_read_data(a, buffer, sizeof buffer);

		if (len < 0)
			ac(len);

		/* left over CR from previous buffer */
		if (a_opt && cr) {
			if (len == 0 || buffer[0] != '\n')
				if (write(fd, "\r", 1) != 1)
					error("write('%s')", pathname);
			cr = 0;
		}

		/* EOF */
		if (len == 0)
			break;
		end = buffer + len;

		/*
		 * Detect whether this is a text file.  The correct way to
		 * do this is to check the least significant bit of the
		 * "internal file attributes" field of the corresponding
		 * file header in the central directory, but libarchive
		 * does not provide access to this field, so we have to
		 * guess by looking for non-ASCII characters in the
		 * buffer.  Hopefully we won't guess wrong.  If we do
		 * guess wrong, we print a warning message later.
		 */
		if (a_opt && n == 0) {
			if (check_binary(buffer, len))
				text = 0;
		}

		/* simple case */
		if (!a_opt || !text) {
			if (write(fd, buffer, len) != len)
				error("write('%s')", pathname);
			continue;
		}

		/* hard case: convert \r\n to \n (sigh...) */
		for (p = buffer; p < end; p = q + 1) {
			for (q = p; q < end; q++) {
				if (!warn && BYTE_IS_BINARY(*q)) {
					warningx("%s may be corrupted due"
					    " to weak text file detection"
					    " heuristic", pathname);
					warn = 1;
				}
				if (q[0] != '\r')
					continue;
				if (&q[1] == end) {
					cr = 1;
					break;
				}
				if (q[1] == '\n')
					break;
			}
			if (write(fd, p, q - p) != q - p)
				error("write('%s')", pathname);
		}
	}

	return text;
}